

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O3

FilterPropagateResult __thiscall
duckdb::CheckZonemapTemplated<duckdb::uhugeint_t>
          (duckdb *this,BaseStatistics *stats,ExpressionType comparison_type,
          array_ptr<duckdb::Value,_true> constants)

{
  undefined8 uVar1;
  uhugeint_t min_value;
  uhugeint_t constant;
  FilterPropagateResult FVar2;
  Value *this_00;
  Value *pVVar3;
  undefined7 in_register_00000011;
  uhugeint_t max_value;
  array_ptr_iterator<duckdb::Value> __begin2;
  Value *pVVar4;
  Value *pVVar5;
  Value *local_58;
  
  pVVar3 = constants.ptr;
  uVar1 = *(undefined8 *)(this + 0x30);
  min_value = *(uhugeint_t *)(this + 0x38);
  local_58 = (Value *)0x0;
  if (pVVar3 != (Value *)0x0) {
    pVVar4 = pVVar3;
    pVVar5 = (Value *)CONCAT71(in_register_00000011,comparison_type);
    do {
      this_00 = array_ptr_iterator<duckdb::Value>::operator*
                          ((array_ptr_iterator<duckdb::Value> *)&stack0xffffffffffffffa0);
      max_value = Value::GetValueUnsafe<duckdb::uhugeint_t>(this_00);
      constant.upper = (uint64_t)pVVar5;
      constant.lower = (uint64_t)pVVar4;
      FVar2 = CheckZonemapTemplated<duckdb::uhugeint_t>
                        (this,(BaseStatistics *)((ulong)stats & 0xff),(ExpressionType)uVar1,
                         min_value,max_value,constant);
      if (FVar2 < FILTER_ALWAYS_FALSE) {
        return FVar2;
      }
      local_58 = (Value *)&(local_58->type_).physical_type_;
      if (pVVar3 <= local_58) {
        local_58 = pVVar3;
      }
    } while (((pVVar5 != (Value *)CONCAT71(in_register_00000011,comparison_type)) ||
             (local_58 != pVVar4)) || (pVVar3 != pVVar4));
  }
  return FILTER_ALWAYS_FALSE;
}

Assistant:

uhugeint_t GetNumericValueUnion::Operation(const NumericValueUnion &v) {
	return v.value_.uhugeint;
}